

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Man_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  
  pAVar3 = p->pNodeToFrames[pObj->Id * p->nFrames + f];
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    iVar1 = Saig_ObjIsPi(p->pAig,pObj);
    if (iVar1 != 0) {
      __assert_fail("!Saig_ObjIsPi(p->pAig, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                    ,0x178,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
    }
    iVar1 = Saig_ObjIsLo(p->pAig,pObj);
    if (iVar1 == 0) {
      if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                      ,0x182,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      Ssw_ManSweepBmcConstr_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
      Ssw_ManSweepBmcConstr_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f);
      p_00 = p->pFrames;
      pAVar3 = Ssw_ObjChild0Fra(p,pObj,f);
      pAVar2 = Ssw_ObjChild1Fra(p,pObj,f);
      pAVar3 = Aig_And(p_00,pAVar3,pAVar2);
    }
    else {
      if (f < 1) {
        __assert_fail("f > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                      ,0x17b,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      pAVar2 = Saig_ObjLoToLi(p->pAig,pObj);
      pAVar3 = Ssw_ManSweepBmcConstr_rec
                         (p,(Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe),f + -1);
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)pAVar2->pFanin0 & 1) ^ (ulong)pAVar3);
    }
    p->pNodeToFrames[pObj->Id * p->nFrames + f] = pAVar3;
    if (pAVar3 == (Aig_Obj_t *)0x0) {
      __assert_fail("pObjNew != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                    ,0x188,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
    }
  }
  return pAVar3;
}

Assistant:

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pObjNew, * pObjLi;
    pObjNew = Ssw_ObjFrame( p, pObj, f );
    if ( pObjNew )
        return pObjNew;
    assert( !Saig_ObjIsPi(p->pAig, pObj) );
    if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( f > 0 );
        pObjLi  = Saig_ObjLoToLi( p->pAig, pObj );
        pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObjLi), f-1 );
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObjLi) );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin1(pObj), f );
        pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
    }
    Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    assert( pObjNew != NULL );
    return pObjNew;
}